

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::RepeatedMessageFieldGenerator::DetermineForwardDeclarations
          (RepeatedMessageFieldGenerator *this,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls,bool include_external_types)

{
  FieldDescriptor *this_00;
  FileDescriptor *pFVar1;
  bool bVar2;
  Descriptor *pDVar3;
  undefined7 in_register_00000011;
  AlphaNum *in_R8;
  string_view key;
  string local_110;
  string local_f0;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  local_d0;
  AlphaNum local_b8;
  AlphaNum local_88;
  string_view local_58 [3];
  
  FieldGenerator::DetermineForwardDeclarations
            ((FieldGenerator *)this,fwd_decls,include_external_types);
  if ((int)CONCAT71(in_register_00000011,include_external_types) != 0) {
    pDVar3 = FieldDescriptor::message_type
                       ((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                        super_SingleFieldGenerator.super_FieldGenerator.descriptor_);
    bVar2 = IsProtobufLibraryBundledProtoFile(pDVar3->file_);
    if (!bVar2) goto LAB_002b1463;
  }
  this_00 = (this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
            super_SingleFieldGenerator.super_FieldGenerator.descriptor_;
  pFVar1 = this_00->file_;
  pDVar3 = FieldDescriptor::message_type(this_00);
  if (pFVar1 != pDVar3->file_) {
    return;
  }
LAB_002b1463:
  local_58[0] = absl::lts_20250127::NullSafeStringView("@class ");
  key._M_str = "msg_type";
  key._M_len = 8;
  SubstitutionMap::Value_abi_cxx11_
            (&local_f0,
             &(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
              super_SingleFieldGenerator.super_FieldGenerator.variables_,key);
  local_88.piece_._M_len = local_f0._M_string_length;
  local_88.piece_._M_str = local_f0._M_dataplus._M_p;
  local_b8.piece_ = absl::lts_20250127::NullSafeStringView(";");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_110,(lts_20250127 *)local_58,&local_88,&local_b8,in_R8);
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  ::insert(&local_d0,
           &fwd_decls->
            super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
           ,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::DetermineForwardDeclarations(
    absl::btree_set<std::string>* fwd_decls,
    bool include_external_types) const {
  RepeatedFieldGenerator::DetermineForwardDeclarations(fwd_decls,
                                                       include_external_types);
  // Within a file there is no requirement on the order of the messages, so
  // local references need a forward declaration. External files (not WKTs),
  // need one when requested.
  if ((include_external_types && !IsProtobufLibraryBundledProtoFile(
                                     descriptor_->message_type()->file())) ||
      descriptor_->file() == descriptor_->message_type()->file()) {
    fwd_decls->insert(absl::StrCat("@class ", variable("msg_type"), ";"));
  }
}